

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O3

bool google::FindSymbol(uint64_t pc,int fd,char *out,size_t out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ssize_t sVar6;
  void *pvVar7;
  ulong uVar8;
  byte bVar9;
  ulong unaff_RBX;
  byte bVar10;
  bool bVar11;
  ulong uVar12;
  Elf64_Sym buf [32];
  uint local_338;
  short local_332;
  long alStack_330 [96];
  
  if (symtab == (Elf64_Shdr *)0x0) {
    bVar11 = false;
  }
  else {
    uVar12 = 0;
    uVar3 = symtab->sh_size / symtab->sh_entsize;
    if (symtab->sh_entsize <= symtab->sh_size) {
      do {
        unaff_RBX = uVar3 - uVar12;
        if (0x1f < unaff_RBX) {
          unaff_RBX = 0x20;
        }
        uVar4 = ReadFromOffset(fd,&local_338,(ulong)(uint)((int)unaff_RBX * 8) * 3,
                               uVar12 * symtab->sh_entsize + symtab->sh_offset);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar4;
        uVar5 = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),0);
        if ((0xaaaaaaaaaaaaaaa < (uVar5 >> 3 | uVar5 << 0x3d)) ||
           (uVar5 = uVar4 / 0x18, unaff_RBX < uVar5)) {
          abort();
        }
        if (0x17 < uVar4) {
          uVar2 = 1;
          uVar4 = 0;
          do {
            if ((alStack_330[uVar4 * 3] != 0) &&
               (uVar8 = alStack_330[uVar4 * 3] + symbol_offset, uVar8 <= pc)) {
              if (((&local_332)[uVar4 * 0xc] != 0) && (pc < uVar8 + alStack_330[uVar4 * 3 + 1])) {
                sVar6 = ReadFromOffset(fd,out,out_size,
                                       (ulong)(&local_338)[uVar4 * 6] + strtab->sh_offset);
                if (sVar6 < 1) {
LAB_00120a67:
                  bVar9 = 0;
                  memset(out,0,out_size);
                }
                else {
                  pvVar7 = memchr(out,0,out_size);
                  bVar9 = 1;
                  if (pvVar7 == (void *)0x0) goto LAB_00120a67;
                }
                bVar10 = 1;
                goto LAB_00120a79;
              }
            }
            uVar4 = (ulong)uVar2;
            uVar2 = uVar2 + 1;
          } while (uVar4 < uVar5);
        }
        uVar12 = (ulong)(uint)((int)uVar12 + (int)uVar5);
      } while (uVar12 < uVar3);
    }
    bVar10 = 0;
    bVar9 = (byte)unaff_RBX;
LAB_00120a79:
    bVar11 = (bool)(bVar10 & bVar9);
  }
  return bVar11;
}

Assistant:

static ATTRIBUTE_NOINLINE bool FindSymbol(uint64_t pc, const int fd, char* out,
                                          size_t out_size,
                                          uint64_t symbol_offset,
                                          const ElfW(Shdr) * strtab,
                                          const ElfW(Shdr) * symtab) {
  if (symtab == nullptr) {
    return false;
  }
  const size_t num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (unsigned i = 0; i < num_symbols;) {
    size_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#    if defined(__WORDSIZE) && __WORDSIZE == 64
    const size_t NUM_SYMBOLS = 32U;
#    else
    const size_t NUM_SYMBOLS = 64U;
#    endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    size_t num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_symbols_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (unsigned j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == nullptr) {
          memset(out, 0, out_size);
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}